

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

SyntaxKind slang::syntax::SyntaxFacts::getKeywordNameExpression(TokenKind kind)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,kind);
  if (iVar1 < 0x12a) {
    if (iVar1 < 0xdd) {
      if (iVar1 == 99) {
        return ArrayAndMethod;
      }
      if (iVar1 == 0xd1) {
        return LocalScope;
      }
    }
    else {
      if (iVar1 == 0xdd) {
        return ConstructorName;
      }
      if (iVar1 == 0xe6) {
        return ArrayOrMethod;
      }
      if (iVar1 == 0x122) {
        return SuperHandle;
      }
    }
  }
  else if (iVar1 < 0x154) {
    if (iVar1 == 0x12a) {
      return ThisHandle;
    }
    if (iVar1 == 0x13b) {
      return ArrayUniqueMethod;
    }
  }
  else {
    if (iVar1 == 0x154) {
      return ArrayXorMethod;
    }
    if (iVar1 == 0x155) {
      return UnitScope;
    }
    if (iVar1 == 0x156) {
      return RootScope;
    }
  }
  return Unknown;
}

Assistant:

SyntaxKind SyntaxFacts::getKeywordNameExpression(TokenKind kind) {
    switch (kind) {
        case TokenKind::UnitSystemName: return SyntaxKind::UnitScope;
        case TokenKind::RootSystemName: return SyntaxKind::RootScope;
        case TokenKind::LocalKeyword: return SyntaxKind::LocalScope;
        case TokenKind::ThisKeyword: return SyntaxKind::ThisHandle;
        case TokenKind::SuperKeyword: return SyntaxKind::SuperHandle;
        case TokenKind::UniqueKeyword: return SyntaxKind::ArrayUniqueMethod;
        case TokenKind::AndKeyword: return SyntaxKind::ArrayAndMethod;
        case TokenKind::OrKeyword: return SyntaxKind::ArrayOrMethod;
        case TokenKind::XorKeyword: return SyntaxKind::ArrayXorMethod;
        case TokenKind::NewKeyword: return SyntaxKind::ConstructorName;
        default: return SyntaxKind::Unknown;
    }
}